

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O2

ZyanStatus ZydisStringAppend(ZyanString *destination,ZyanStringView *source)

{
  ZyanUSize ZVar1;
  ZyanUSize ZVar2;
  ZyanStatus ZVar3;
  
  if (destination == (ZyanString *)0x0) {
    __assert_fail("destination && source",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0x86,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
  }
  if ((destination->vector).allocator == (ZyanAllocator *)0x0) {
    ZVar1 = (destination->vector).size;
    if ((ZVar1 != 0) && (ZVar2 = (source->string).vector.size, ZVar2 != 0)) {
      ZVar3 = 0x80100009;
      if ((ZVar1 + ZVar2) - 1 <= (destination->vector).capacity) {
        memcpy((void *)((long)(destination->vector).data + (ZVar1 - 1)),(source->string).vector.data
               ,ZVar2 - 1);
        ZVar1 = (source->string).vector.size;
        ZVar2 = (destination->vector).size;
        (destination->vector).size = (ZVar1 + ZVar2) - 1;
        *(undefined1 *)((long)(destination->vector).data + ZVar1 + ZVar2 + -2) = 0;
        ZVar3 = 0x100000;
      }
      return ZVar3;
    }
    __assert_fail("destination->vector.size && source->string.vector.size",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0x88,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
  }
  __assert_fail("!destination->vector.allocator",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                ,0x87,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppend(ZyanString* destination, const ZyanStringView* source)
{
    ZYAN_ASSERT(destination && source);
    ZYAN_ASSERT(!destination->vector.allocator);
    ZYAN_ASSERT(destination->vector.size && source->string.vector.size);

    if (destination->vector.size + source->string.vector.size - 1 > destination->vector.capacity)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZYAN_MEMCPY((char*)destination->vector.data + destination->vector.size - 1,
        source->string.vector.data, source->string.vector.size - 1);

    destination->vector.size += source->string.vector.size - 1;
    ZYDIS_STRING_NULLTERMINATE(destination);

    return ZYAN_STATUS_SUCCESS;
}